

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImDrawList *draw_list;
  bool bVar3;
  ImVec2 IVar4;
  float _y;
  float local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImU32 local_74;
  ImVec2 IStack_70;
  ImU32 text_col;
  undefined1 local_68 [8];
  ImRect bb;
  ImVec2 pos;
  ImVec2 total_size;
  ImVec2 label_size;
  char *text_end;
  char *text_begin;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  __va_list_tag *args_local;
  char *fmt_local;
  
  window = (ImGuiWindow *)args;
  args_local = (__va_list_tag *)fmt;
  g = (ImGuiContext *)GetCurrentWindow();
  if (((ulong)(g->IO).BackendRendererUserData & 0x1000000) == 0) {
    style = (ImGuiStyle *)GImGui;
    text_begin = (char *)&GImGui->Style;
    ImFormatStringToTempBufferV
              (&text_end,(char **)&label_size,(char *)args_local,(__va_list_tag *)window);
    IVar4 = CalcTextSize(text_end,(char *)label_size,false,-1.0);
    total_size.x = IVar4.x;
    if (total_size.x <= 0.0) {
      local_9c = 0.0;
    }
    else {
      local_9c = *(float *)(text_begin + 0x3c) + *(float *)(text_begin + 0x3c) + total_size.x;
    }
    total_size.y = IVar4.y;
    ImVec2::ImVec2(&pos,style[0xe].Colors[0x20].x + local_9c,total_size.y);
    uVar1 = (g->IO).MetricsRenderIndices;
    uVar2 = (g->IO).MetricsRenderWindows;
    bb.Max.y = (float)uVar2 + (float)(g->IO).KeyMap[8];
    bb.Max.x = (float)uVar1;
    ItemSize(&pos,0.0);
    IStack_70 = operator+(&bb.Max,&pos);
    ImRect::ImRect((ImRect *)local_68,&bb.Max,&stack0xffffffffffffff90);
    bVar3 = ItemAdd((ImRect *)local_68,0,(ImRect *)0x0,0);
    if (bVar3) {
      local_74 = GetColorU32(0,1.0);
      draw_list = *(ImDrawList **)((g->IO).KeyMap + 0x62);
      _y = style[0xe].Colors[0x20].x * 0.5;
      ImVec2::ImVec2(&local_84,_y + *(float *)(text_begin + 0x3c),_y);
      local_7c = operator+((ImVec2 *)local_68,&local_84);
      RenderBullet(draw_list,local_7c,local_74);
      ImVec2::ImVec2(&local_94,
                     *(float *)(text_begin + 0x3c) + *(float *)(text_begin + 0x3c) +
                     style[0xe].Colors[0x20].x,0.0);
      local_8c = operator+((ImVec2 *)local_68,&local_94);
      RenderText(local_8c,text_end,(char *)label_size,false);
    }
  }
  return;
}

Assistant:

void ImGui::BulletTextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const char* text_begin, *text_end;
    ImFormatStringToTempBufferV(&text_begin, &text_end, fmt, args);
    const ImVec2 label_size = CalcTextSize(text_begin, text_end, false);
    const ImVec2 total_size = ImVec2(g.FontSize + (label_size.x > 0.0f ? (label_size.x + style.FramePadding.x * 2) : 0.0f), label_size.y);  // Empty text doesn't add padding
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(total_size, 0.0f);
    const ImRect bb(pos, pos + total_size);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderBullet(window->DrawList, bb.Min + ImVec2(style.FramePadding.x + g.FontSize * 0.5f, g.FontSize * 0.5f), text_col);
    RenderText(bb.Min + ImVec2(g.FontSize + style.FramePadding.x * 2, 0.0f), text_begin, text_end, false);
}